

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Echo.cpp
# Opt level: O2

void __thiscall helics::apps::Echo::echoMessage(Echo *this,Endpoint *ept,Time currentTime)

{
  pointer __p;
  string_view dest;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> m;
  undefined1 local_60 [16];
  pointer local_50;
  _Alloc_hider local_48;
  size_type local_40;
  undefined8 uStack_38;
  
  Endpoint::getMessage((Endpoint *)local_60);
  local_60._8_8_ = &this->delayTimeLock;
  CLI::std::mutex::lock((mutex *)local_60._8_8_);
  while ((Message *)local_60._0_8_ != (Message *)0x0) {
    local_50 = (pointer)((SmallBuffer *)(local_60._0_8_ + 0x10))->bufferSize;
    local_48._M_p = (pointer)((SmallBuffer *)(local_60._0_8_ + 0x10))->heap;
    local_40 = 0;
    uStack_38 = 0;
    dest._M_str = (((string *)(local_60._0_8_ + 0xb0))->_M_dataplus)._M_p;
    dest._M_len = ((string *)(local_60._0_8_ + 0xb0))->_M_string_length;
    Endpoint::sendToAt(ept,(data_view *)&stack0xffffffffffffffb0,dest,
                       (Time)((this->delayTime).internalTimeCode + currentTime.internalTimeCode));
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
    Endpoint::getMessage((Endpoint *)&stack0xffffffffffffffb0);
    __p = local_50;
    local_50 = (pointer)0x0;
    CLI::std::__uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>::reset
              ((__uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_> *)local_60,
               __p);
    CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
               &stack0xffffffffffffffb0);
  }
  pthread_mutex_unlock((pthread_mutex_t *)local_60._8_8_);
  CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)local_60);
  return;
}

Assistant:

void Echo::echoMessage(const Endpoint& ept, Time currentTime)
    {
        auto m = ept.getMessage();
        std::lock_guard<std::mutex> lock(delayTimeLock);
        while (m) {
            ept.sendToAt(m->data, m->original_source, currentTime + delayTime);
            m = ept.getMessage();
        }
    }